

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O0

void bn_mul_high(unsigned_long *r,unsigned_long *a,unsigned_long *b,unsigned_long *l,int n2,
                unsigned_long *t)

{
  int n_00;
  int iVar1;
  int iVar2;
  ulong uVar3;
  unsigned_long *in_RCX;
  unsigned_long *in_RDX;
  unsigned_long *in_RSI;
  ulong *in_RDI;
  int in_R8D;
  unsigned_long *in_R9;
  unsigned_long *mp;
  unsigned_long *lp;
  unsigned_long lc;
  unsigned_long ll;
  int zero;
  int oneg;
  int neg;
  int c2;
  int c1;
  int n;
  int i;
  unsigned_long *in_stack_00000308;
  unsigned_long *in_stack_00000310;
  unsigned_long *in_stack_00000318;
  ulong *local_68;
  ulong local_60;
  int dnb;
  int n2_00;
  int iVar4;
  undefined4 in_stack_ffffffffffffffcc;
  
  n_00 = in_R8D / 2;
  dnb = 0;
  n2_00 = 0;
  iVar1 = bn_cmp_words(in_RSI,in_RSI + n_00,n_00);
  iVar2 = bn_cmp_words(in_RDX + n_00,in_RDX,n_00);
  switch(iVar2 + 4 + iVar1 * 3) {
  case 0:
    bn_sub_words(in_RDI,in_RSI + n_00,in_RSI,n_00);
    bn_sub_words(in_RDI + n_00,in_RDX,in_RDX + n_00,n_00);
    break;
  case 1:
    dnb = 1;
    break;
  case 2:
    bn_sub_words(in_RDI,in_RSI + n_00,in_RSI,n_00);
    bn_sub_words(in_RDI + n_00,in_RDX + n_00,in_RDX,n_00);
    n2_00 = 1;
    break;
  case 3:
  case 4:
  case 5:
    dnb = 1;
    break;
  case 6:
    bn_sub_words(in_RDI,in_RSI,in_RSI + n_00,n_00);
    bn_sub_words(in_RDI + n_00,in_RDX,in_RDX + n_00,n_00);
    n2_00 = 1;
    break;
  case 7:
    dnb = 1;
    break;
  case 8:
    bn_sub_words(in_RDI,in_RSI,in_RSI + n_00,n_00);
    bn_sub_words(in_RDI + n_00,in_RDX + n_00,in_RDX,n_00);
  }
  iVar4 = n2_00;
  if (n_00 == 8) {
    bn_mul_comba8(in_stack_00000318,in_stack_00000310,in_stack_00000308);
    bn_mul_comba8(in_stack_00000318,in_stack_00000310,in_stack_00000308);
  }
  else {
    bn_mul_recursive(in_R9,(unsigned_long *)CONCAT44(in_stack_ffffffffffffffcc,n_00),
                     (unsigned_long *)CONCAT44(iVar1,iVar2),n2_00,n2_00,dnb,in_RCX);
    bn_mul_recursive(in_R9,(unsigned_long *)CONCAT44(in_stack_ffffffffffffffcc,n_00),
                     (unsigned_long *)CONCAT44(iVar1,iVar2),iVar4,n2_00,dnb,in_RCX);
  }
  local_68 = in_RDI;
  if (in_RCX != (ulong *)0x0) {
    local_68 = in_R9 + (in_R8D + n_00);
    bn_add_words(local_68,in_RDI,in_RCX,n_00);
  }
  if (iVar4 == 0) {
    bn_add_words(in_R9 + in_R8D,local_68,in_R9,n_00);
  }
  else {
    bn_sub_words(in_R9 + in_R8D,local_68,in_R9,n_00);
  }
  if (in_RCX == (ulong *)0x0) {
    for (iVar1 = 0; iVar1 < n_00; iVar1 = iVar1 + 1) {
      in_R9[(long)(in_R8D + n_00) + (long)iVar1] =
           (in_R9[(long)in_R8D + (long)iVar1] ^ 0xffffffffffffffff) + 1;
    }
  }
  else {
    bn_sub_words(in_R9 + (in_R8D + n_00),in_RCX + n_00,in_R9 + in_R8D,n_00);
  }
  if (in_RCX == (ulong *)0x0) {
    local_68 = in_R9 + (in_R8D + n_00);
    iVar1 = 0;
  }
  else {
    local_68 = in_R9 + in_R8D;
    uVar3 = bn_add_words(local_68,in_R9 + (in_R8D + n_00),in_RCX,n_00);
    iVar1 = (int)uVar3;
  }
  uVar3 = bn_add_words(in_R9 + in_R8D,local_68,in_RDI,n_00);
  iVar1 = (int)uVar3 + iVar1;
  if (n2_00 == 0) {
    uVar3 = bn_add_words(in_R9 + in_R8D,in_R9 + in_R8D,in_R9,n_00);
    iVar1 = (int)uVar3 + iVar1;
  }
  else {
    uVar3 = bn_sub_words(in_R9 + in_R8D,in_R9 + in_R8D,in_R9,n_00);
    iVar1 = iVar1 - (int)uVar3;
  }
  uVar3 = bn_add_words(in_RDI,in_RDI,in_R9 + (in_R8D + n_00),n_00);
  iVar2 = (int)uVar3;
  uVar3 = bn_add_words(in_RDI,in_RDI,in_RDI + n_00,n_00);
  iVar2 = (int)uVar3 + iVar2;
  if (n2_00 == 0) {
    uVar3 = bn_add_words(in_RDI,in_RDI,in_R9 + n_00,n_00);
    iVar2 = (int)uVar3 + iVar2;
  }
  else {
    uVar3 = bn_sub_words(in_RDI,in_RDI,in_R9 + n_00,n_00);
    iVar2 = iVar2 - (int)uVar3;
  }
  if (iVar1 != 0) {
    if (iVar1 < 1) {
      local_60 = (ulong)-iVar1;
      iVar1 = 0;
      do {
        uVar3 = in_RDI[iVar1];
        in_RDI[iVar1] = uVar3 - local_60;
        local_60 = (ulong)(int)(uint)(uVar3 < local_60);
        iVar1 = iVar1 + 1;
      } while (local_60 != 0);
    }
    else {
      local_60 = (ulong)iVar1;
      iVar1 = 0;
      do {
        uVar3 = in_RDI[iVar1];
        in_RDI[iVar1] = uVar3 + local_60;
        local_60 = (ulong)(int)(uint)(uVar3 + local_60 < local_60);
        iVar1 = iVar1 + 1;
      } while (local_60 != 0);
    }
  }
  if (iVar2 != 0) {
    if (iVar2 < 1) {
      local_60 = (ulong)-iVar2;
      do {
        uVar3 = in_RDI[n_00];
        in_RDI[n_00] = uVar3 - local_60;
        local_60 = (ulong)(int)(uint)(uVar3 < local_60);
        n_00 = n_00 + 1;
      } while (local_60 != 0);
    }
    else {
      local_60 = (ulong)iVar2;
      do {
        uVar3 = in_RDI[n_00];
        in_RDI[n_00] = uVar3 + local_60;
        local_60 = (ulong)(int)(uint)(uVar3 + local_60 < local_60);
        n_00 = n_00 + 1;
      } while (local_60 != 0);
    }
  }
  return;
}

Assistant:

void bn_mul_high(BN_ULONG *r, BN_ULONG *a, BN_ULONG *b, BN_ULONG *l, int n2,
                 BN_ULONG *t)
{
    int i, n;
    int c1, c2;
    int neg, oneg, zero;
    BN_ULONG ll, lc, *lp, *mp;

    n = n2 / 2;

    /* Calculate (al-ah)*(bh-bl) */
    neg = zero = 0;
    c1 = bn_cmp_words(&(a[0]), &(a[n]), n);
    c2 = bn_cmp_words(&(b[n]), &(b[0]), n);
    switch (c1 * 3 + c2) {
    case -4:
        bn_sub_words(&(r[0]), &(a[n]), &(a[0]), n);
        bn_sub_words(&(r[n]), &(b[0]), &(b[n]), n);
        break;
    case -3:
        zero = 1;
        break;
    case -2:
        bn_sub_words(&(r[0]), &(a[n]), &(a[0]), n);
        bn_sub_words(&(r[n]), &(b[n]), &(b[0]), n);
        neg = 1;
        break;
    case -1:
    case 0:
    case 1:
        zero = 1;
        break;
    case 2:
        bn_sub_words(&(r[0]), &(a[0]), &(a[n]), n);
        bn_sub_words(&(r[n]), &(b[0]), &(b[n]), n);
        neg = 1;
        break;
    case 3:
        zero = 1;
        break;
    case 4:
        bn_sub_words(&(r[0]), &(a[0]), &(a[n]), n);
        bn_sub_words(&(r[n]), &(b[n]), &(b[0]), n);
        break;
    }

    oneg = neg;
    /* t[10] = (a[0]-a[1])*(b[1]-b[0]) */
    /* r[10] = (a[1]*b[1]) */
# ifdef BN_MUL_COMBA
    if (n == 8) {
        bn_mul_comba8(&(t[0]), &(r[0]), &(r[n]));
        bn_mul_comba8(r, &(a[n]), &(b[n]));
    } else
# endif
    {
        bn_mul_recursive(&(t[0]), &(r[0]), &(r[n]), n, 0, 0, &(t[n2]));
        bn_mul_recursive(r, &(a[n]), &(b[n]), n, 0, 0, &(t[n2]));
    }

    /*-
     * s0 == low(al*bl)
     * s1 == low(ah*bh)+low((al-ah)*(bh-bl))+low(al*bl)+high(al*bl)
     * We know s0 and s1 so the only unknown is high(al*bl)
     * high(al*bl) == s1 - low(ah*bh+s0+(al-ah)*(bh-bl))
     * high(al*bl) == s1 - (r[0]+l[0]+t[0])
     */
    if (l != NULL) {
        lp = &(t[n2 + n]);
        bn_add_words(lp, &(r[0]), &(l[0]), n);
    } else {
        lp = &(r[0]);
    }

    if (neg)
        neg = (int)(bn_sub_words(&(t[n2]), lp, &(t[0]), n));
    else {
        bn_add_words(&(t[n2]), lp, &(t[0]), n);
        neg = 0;
    }

    if (l != NULL) {
        bn_sub_words(&(t[n2 + n]), &(l[n]), &(t[n2]), n);
    } else {
        lp = &(t[n2 + n]);
        mp = &(t[n2]);
        for (i = 0; i < n; i++)
            lp[i] = ((~mp[i]) + 1) & BN_MASK2;
    }

    /*-
     * s[0] = low(al*bl)
     * t[3] = high(al*bl)
     * t[10] = (a[0]-a[1])*(b[1]-b[0]) neg is the sign
     * r[10] = (a[1]*b[1])
     */
    /*-
     * R[10] = al*bl
     * R[21] = al*bl + ah*bh + (a[0]-a[1])*(b[1]-b[0])
     * R[32] = ah*bh
     */
    /*-
     * R[1]=t[3]+l[0]+r[0](+-)t[0] (have carry/borrow)
     * R[2]=r[0]+t[3]+r[1](+-)t[1] (have carry/borrow)
     * R[3]=r[1]+(carry/borrow)
     */
    if (l != NULL) {
        lp = &(t[n2]);
        c1 = (int)(bn_add_words(lp, &(t[n2 + n]), &(l[0]), n));
    } else {
        lp = &(t[n2 + n]);
        c1 = 0;
    }
    c1 += (int)(bn_add_words(&(t[n2]), lp, &(r[0]), n));
    if (oneg)
        c1 -= (int)(bn_sub_words(&(t[n2]), &(t[n2]), &(t[0]), n));
    else
        c1 += (int)(bn_add_words(&(t[n2]), &(t[n2]), &(t[0]), n));

    c2 = (int)(bn_add_words(&(r[0]), &(r[0]), &(t[n2 + n]), n));
    c2 += (int)(bn_add_words(&(r[0]), &(r[0]), &(r[n]), n));
    if (oneg)
        c2 -= (int)(bn_sub_words(&(r[0]), &(r[0]), &(t[n]), n));
    else
        c2 += (int)(bn_add_words(&(r[0]), &(r[0]), &(t[n]), n));

    if (c1 != 0) {              /* Add starting at r[0], could be +ve or -ve */
        i = 0;
        if (c1 > 0) {
            lc = c1;
            do {
                ll = (r[i] + lc) & BN_MASK2;
                r[i++] = ll;
                lc = (lc > ll);
            } while (lc);
        } else {
            lc = -c1;
            do {
                ll = r[i];
                r[i++] = (ll - lc) & BN_MASK2;
                lc = (lc > ll);
            } while (lc);
        }
    }
    if (c2 != 0) {              /* Add starting at r[1] */
        i = n;
        if (c2 > 0) {
            lc = c2;
            do {
                ll = (r[i] + lc) & BN_MASK2;
                r[i++] = ll;
                lc = (lc > ll);
            } while (lc);
        } else {
            lc = -c2;
            do {
                ll = r[i];
                r[i++] = (ll - lc) & BN_MASK2;
                lc = (lc > ll);
            } while (lc);
        }
    }
}